

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O3

LY_ERR lys_compile_node_notif(lysc_ctx *ctx,lysp_node *pnode,lysc_node *node)

{
  lys_module *plVar1;
  LY_ERR LVar2;
  long *plVar3;
  lysp_ext_instance *plVar4;
  long lVar5;
  lysp_restr *must_p;
  long lVar6;
  long lVar7;
  lysp_ext_instance *plVar8;
  lysp_node *plVar9;
  
  plVar9 = pnode[1].parent;
  if (plVar9 != (lysp_node *)0x0) {
    plVar1 = node[1].module;
    if (plVar1 == (lys_module *)0x0) {
      plVar3 = (long *)calloc(1,(long)plVar9[-1].exts * 0x38 + 8);
      if (plVar3 == (long *)0x0) goto LAB_0014b043;
      lVar5 = 0;
      lVar6 = 0;
    }
    else {
      lVar6 = *(long *)&plVar1[-1].implemented;
      plVar3 = (long *)realloc(&plVar1[-1].implemented,
                               ((long)&(plVar9[-1].exts)->name + lVar6 * 2) * 0x38 + 8);
      if (plVar3 == (long *)0x0) {
LAB_0014b043:
        ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_node_notif"
              );
        return LY_EMEM;
      }
      lVar5 = *plVar3;
    }
    node[1].module = (lys_module *)(plVar3 + 1);
    if (pnode[1].parent == (lysp_node *)0x0) {
      plVar8 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar8 = pnode[1].parent[-1].exts;
    }
    lVar7 = 0;
    memset(plVar3 + lVar5 * 7 + 1,0,((long)&plVar8->name + lVar6) * 0x38);
    plVar8 = (lysp_ext_instance *)0xffffffffffffffff;
    while( true ) {
      plVar9 = pnode[1].parent;
      if (plVar9 == (lysp_node *)0x0) {
        plVar4 = (lysp_ext_instance *)0x0;
      }
      else {
        plVar4 = plVar9[-1].exts;
      }
      plVar8 = (lysp_ext_instance *)((long)&plVar8->name + 1);
      if (plVar4 <= plVar8) break;
      plVar1 = node[1].module;
      lVar6 = *(long *)&plVar1[-1].implemented;
      *(long *)&plVar1[-1].implemented = lVar6 + 1;
      must_p = (lysp_restr *)((long)&plVar9->parent + lVar7);
      lVar7 = lVar7 + 0x40;
      LVar2 = lys_compile_must(ctx,must_p,(lysc_must *)(&plVar1->ctx + lVar6 * 7));
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
    }
  }
  LVar2 = lysc_unres_must_add(ctx,node,pnode);
  if (LVar2 != LY_SUCCESS) {
    return LY_EMEM;
  }
  plVar9 = (lysp_node *)pnode[1].name;
  while( true ) {
    if (plVar9 == (lysp_node *)0x0) {
      LVar2 = lys_compile_node_augments(ctx,node);
      return LVar2;
    }
    LVar2 = lys_compile_node(ctx,plVar9,node,0,(ly_set *)0x0);
    if (LVar2 != LY_SUCCESS) break;
    plVar9 = plVar9->next;
  }
  return LVar2;
}

Assistant:

static LY_ERR
lys_compile_node_notif(struct lysc_ctx *ctx, struct lysp_node *pnode, struct lysc_node *node)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysp_node_notif *notif_p = (struct lysp_node_notif *)pnode;
    struct lysc_node_notif *notif = (struct lysc_node_notif *)node;
    struct lysp_node *child_p;

    COMPILE_ARRAY_GOTO(ctx, notif_p->musts, notif->musts, lys_compile_must, ret, done);

    /* add must(s) to unres */
    ret = lysc_unres_must_add(ctx, node, pnode);
    LY_CHECK_GOTO(ret, done);

    LY_LIST_FOR(notif_p->child, child_p) {
        ret = lys_compile_node(ctx, child_p, node, 0, NULL);
        LY_CHECK_GOTO(ret, done);
    }

    /* connect any augments */
    LY_CHECK_GOTO(ret = lys_compile_node_augments(ctx, node), done);

done:
    return ret;
}